

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcer.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  recursive_directory_iterator *this;
  long lVar1;
  bool bVar2;
  byte bVar3;
  uchar byte;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  ostream *poVar7;
  directory_entry *pdVar8;
  path *ppVar9;
  uintmax_t uVar10;
  uintmax_t *puVar11;
  size_type sVar12;
  pointer ppVar13;
  undefined1 local_608 [4];
  int c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  undefined1 local_5c8 [8];
  ifstream file;
  iterator local_3c0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  local_3b8;
  iterator local_3b0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  local_3a8;
  const_iterator iter_1;
  iterator iStack_398;
  int checkByteNum;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  local_390;
  iterator local_388;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  local_380;
  const_iterator iter;
  int offset;
  int resourceDataSize;
  ofstream output;
  long size;
  string local_148;
  undefined1 local_128 [8];
  string filepath;
  undefined1 local_f8 [8];
  recursive_directory_iterator dir_1;
  path local_c8;
  undefined1 local_a8 [8];
  path inputDir;
  undefined1 local_80 [8];
  string dir;
  int local_50;
  int local_4c;
  int filenamesSize;
  int totalSize;
  FileInfos files;
  char **argv_local;
  int argc_local;
  
  files._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)argv;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)&filenamesSize);
  local_4c = 0;
  local_50 = 0;
  if (2 < argc) {
    pcVar6 = *(char **)(files._M_t._M_impl.super__Rb_tree_header._M_node_count + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_80,pcVar6,
               (allocator<char> *)(inputDir._path.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(inputDir._path.field_2._M_local_buf + 0xf))
    ;
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::length();
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
      if (*pcVar6 != '/') {
        std::__cxx11::string::length();
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
        if (*pcVar6 != '\\') {
          std::__cxx11::string::operator+=((string *)local_80,"/");
        }
      }
    }
    ghc::filesystem::path::path<std::__cxx11::string,ghc::filesystem::path>
              (&local_c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
               auto_format);
    ghc::filesystem::canonical((path *)local_a8,&local_c8);
    ghc::filesystem::path::~path(&local_c8);
    poVar7 = std::operator<<((ostream *)&std::clog,"Reading content of \'");
    ghc::filesystem::path::string_abi_cxx11_
              ((string *)
               &dir_1._impl.
                super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,(path *)local_a8);
    poVar7 = std::operator<<(poVar7,(string *)
                                    &dir_1._impl.
                                     super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
    poVar7 = std::operator<<(poVar7,"\' ...");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string
              ((string *)
               &dir_1._impl.
                super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator
              ((recursive_directory_iterator *)local_f8,(path *)local_a8);
    while( true ) {
      this = (recursive_directory_iterator *)((long)&filepath.field_2 + 8);
      ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator(this);
      bVar2 = ghc::filesystem::recursive_directory_iterator::operator!=
                        ((recursive_directory_iterator *)local_f8,this);
      ghc::filesystem::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)((long)&filepath.field_2 + 8));
      if (!bVar2) break;
      pdVar8 = ghc::filesystem::recursive_directory_iterator::operator->
                         ((recursive_directory_iterator *)local_f8);
      ppVar9 = ghc::filesystem::directory_entry::path(pdVar8);
      ghc::filesystem::path::string_abi_cxx11_(&local_148,ppVar9);
      ghc::filesystem::path::string_abi_cxx11_((string *)&size,(path *)local_a8);
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_128,(ulong)&local_148);
      std::__cxx11::string::~string((string *)&size);
      std::__cxx11::string::~string((string *)&local_148);
      uVar5 = std::__cxx11::string::empty();
      if (((uVar5 & 1) == 0) &&
         (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_128), *pcVar6 != '.')) {
        pdVar8 = ghc::filesystem::recursive_directory_iterator::operator*
                           ((recursive_directory_iterator *)local_f8);
        ppVar9 = ghc::filesystem::directory_entry::operator_cast_to_path_(pdVar8);
        bVar2 = ghc::filesystem::is_regular_file(ppVar9);
        if (bVar2) {
          pdVar8 = ghc::filesystem::recursive_directory_iterator::operator*
                             ((recursive_directory_iterator *)local_f8);
          ppVar9 = ghc::filesystem::directory_entry::operator_cast_to_path_(pdVar8);
          uVar10 = ghc::filesystem::file_size(ppVar9);
          poVar7 = std::operator<<((ostream *)&std::cout,(string *)local_128);
          poVar7 = std::operator<<(poVar7," (");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar10);
          poVar7 = std::operator<<(poVar7,")");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          puVar11 = (uintmax_t *)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                  *)&filenamesSize,(key_type *)local_128);
          *puVar11 = uVar10;
          local_4c = local_4c + (int)uVar10;
          iVar4 = std::__cxx11::string::length();
          local_50 = local_50 + iVar4;
        }
      }
      std::__cxx11::string::~string((string *)local_128);
      ghc::filesystem::recursive_directory_iterator::operator++
                ((recursive_directory_iterator *)local_f8);
    }
    ghc::filesystem::recursive_directory_iterator::~recursive_directory_iterator
              ((recursive_directory_iterator *)local_f8);
    poVar7 = std::operator<<((ostream *)&std::clog,"Found ");
    sVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     *)&filenamesSize);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar12);
    poVar7 = std::operator<<(poVar7," files with ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_4c);
    poVar7 = std::operator<<(poVar7," bytes of data, processing...");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::ofstream::ofstream
              (&offset,*(char **)(files._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10),
               _S_trunc);
    sVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     *)&filenamesSize);
    iter._M_node._4_4_ = local_50 + 5 + local_4c + (int)sVar12 * 0xc;
    poVar7 = std::operator<<((ostream *)&offset,"const int g_resourceDataSize = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iter._M_node._4_4_);
    poVar7 = std::operator<<(poVar7,";");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)&offset,"const unsigned char g_resourceData[");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iter._M_node._4_4_);
    poVar7 = std::operator<<(poVar7,"] = {");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    sVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     *)&filenamesSize);
    writeInt((ostream *)&offset,(int)sVar12);
    sVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     *)&filenamesSize);
    iter._M_node._0_4_ = (int)(sVar12 << 2) + 4;
    local_388._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)&filenamesSize);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
    ::_Rb_tree_const_iterator(&local_380,&local_388);
    while( true ) {
      iStack_398 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                          *)&filenamesSize);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
      ::_Rb_tree_const_iterator(&local_390,&stack0xfffffffffffffc68);
      bVar2 = std::operator!=(&local_380,&local_390);
      if (!bVar2) break;
      writeInt((ostream *)&offset,(int)iter._M_node);
      ppVar13 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                ::operator->(&local_380);
      lVar1 = ppVar13->second;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
      ::operator->(&local_380);
      iVar4 = std::__cxx11::string::length();
      iter._M_node._0_4_ = (int)iter._M_node + (int)lVar1 + 8 + iVar4;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
      ::operator++(&local_380);
    }
    iter_1._M_node._4_4_ = 0;
    sVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     *)&filenamesSize);
    iter._M_node._0_4_ = (int)(sVar12 << 2) + 4;
    local_3b0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)&filenamesSize);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
    ::_Rb_tree_const_iterator(&local_3a8,&local_3b0);
    while( true ) {
      local_3c0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)&filenamesSize);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
      ::_Rb_tree_const_iterator(&local_3b8,&local_3c0);
      bVar2 = std::operator!=(&local_3a8,&local_3b8);
      if (!bVar2) break;
      poVar7 = std::operator<<((ostream *)&std::clog,"packing \'");
      ppVar13 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                ::operator->(&local_3a8);
      poVar7 = std::operator<<(poVar7,(string *)ppVar13);
      poVar7 = std::operator<<(poVar7,"\' ...");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      if (globalCount != (int)iter._M_node) {
        poVar7 = std::operator<<((ostream *)&std::clog,"    error: expected offset ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)iter._M_node);
        poVar7 = std::operator<<(poVar7," current offset ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,globalCount);
        poVar7 = std::operator<<(poVar7," !!!");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      ppVar13 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                ::operator->(&local_3a8);
      writeInt((ostream *)&offset,(int)ppVar13->second);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
      ::operator->(&local_3a8);
      iVar4 = std::__cxx11::string::length();
      writeInt((ostream *)&offset,iVar4);
      ppVar13 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                ::operator->(&local_3a8);
      writeString((ostream *)&offset,&ppVar13->first);
      std::__cxx11::string::string((string *)local_608,(string *)local_80);
      ppVar13 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                ::operator->(&local_3a8);
      std::operator+(&local_5e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608,
                     &ppVar13->first);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(local_5c8,pcVar6,_S_bin);
      std::__cxx11::string::~string((string *)&local_5e8);
      std::__cxx11::string::~string((string *)local_608);
      while (bVar3 = std::ios::eof(), ((bVar3 ^ 0xff) & 1) != 0) {
        byte = std::istream::get();
        bVar3 = std::ios::eof();
        if ((bVar3 & 1) == 0) {
          writeByte((ostream *)&offset,byte);
          iter_1._M_node._4_4_ = iter_1._M_node._4_4_ + 1;
        }
      }
      poVar7 = std::operator<<((ostream *)&std::clog," imported ");
      ppVar13 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                ::operator->(&local_3a8);
      poVar7 = std::operator<<(poVar7,(string *)ppVar13);
      poVar7 = std::operator<<(poVar7," with ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iter_1._M_node._4_4_);
      poVar7 = std::operator<<(poVar7," bytes");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      ppVar13 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                ::operator->(&local_3a8);
      lVar1 = ppVar13->second;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
      ::operator->(&local_3a8);
      iVar4 = std::__cxx11::string::length();
      iter._M_node._0_4_ = (int)iter._M_node + (int)lVar1 + 8 + iVar4;
      iter_1._M_node._4_4_ = 0;
      std::ifstream::~ifstream(local_5c8);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
      ::operator++(&local_3a8);
    }
    poVar7 = std::operator<<((ostream *)&offset,(string *)&lineBuffer_abi_cxx11_);
    poVar7 = std::operator<<(poVar7,"0");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)&offset,"};");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::ofstream::close();
    poVar7 = (ostream *)std::ostream::operator<<(&std::clog,globalCount);
    poVar7 = std::operator<<(poVar7," / ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)iter._M_node);
    poVar7 = std::operator<<(poVar7," bytes done.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::ofstream::~ofstream(&offset);
    ghc::filesystem::path::~path((path *)local_a8);
    std::__cxx11::string::~string((string *)local_80);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
            *)&filenamesSize);
    return 0;
  }
  puts("USAGE: resourcer <directory> <outputfile>");
  exit(-1);
}

Assistant:

int main(int argc, char* argv[])
{
    FileInfos files;
    int totalSize = 0;
    int filenamesSize = 0;
    if (argc < 3) {
        puts("USAGE: resourcer <directory> <outputfile>");
        exit(-1);
    }

    std::string dir = argv[1];
    if (!dir.empty() && dir[dir.length() - 1] != '/' && dir[dir.length() - 1] != '\\') {
        dir += "/";
    }

    fs::path inputDir = fs::canonical(dir);
    std::clog << "Reading content of '" << inputDir.string() << "' ..." << std::endl;

    for (fs::recursive_directory_iterator dir(inputDir); dir != fs::recursive_directory_iterator(); ++dir) {
        std::string filepath = dir->path().string().substr(inputDir.string().length() + 1);
        if (!filepath.empty() && filepath[0] != '.' && fs::is_regular_file(*dir)) {
            long size = (long)fs::file_size(*dir);
            std::cout << filepath << " (" << size << ")" << std::endl;
            files[filepath] = size;
            totalSize += size;
            filenamesSize += filepath.length();
        }
    }

    std::clog << "Found " << files.size() << " files with " << totalSize << " bytes of data, processing..." << std::endl;

    std::ofstream output(argv[2], std::ios::trunc);
    int resourceDataSize = (totalSize + 4 + files.size() * 12 + filenamesSize + 1);
    output << "const int g_resourceDataSize = " << resourceDataSize << ";" << std::endl;
    output << "const unsigned char g_resourceData[" << resourceDataSize << "] = {" << std::endl;
    writeInt(output, files.size());
    int offset = 4 + files.size() * 4;
    for (FileInfos::const_iterator iter = files.begin(); iter != files.end(); ++iter) {
        writeInt(output, offset);
        offset += iter->second + 8 + iter->first.length();
    }
    int checkByteNum = 0;
    offset = 4 + files.size() * 4;
    for (FileInfos::const_iterator iter = files.begin(); iter != files.end(); ++iter) {
        std::clog << "packing '" << iter->first << "' ..." << std::endl;
        if (globalCount != offset) {
            std::clog << "    error: expected offset " << offset << " current offset " << globalCount << " !!!" << std::endl;
        }
        writeInt(output, iter->second);
        writeInt(output, iter->first.length());
        writeString(output, iter->first);
        std::ifstream file((std::string(dir) + iter->first).c_str(), std::ios::binary);
        int c;
        while (!file.eof()) {
            c = file.get();
            if (!file.eof()) {
                writeByte(output, (unsigned char)c);
                ++checkByteNum;
            }
        }
        std::clog << " imported " << iter->first << " with " << checkByteNum << " bytes" << std::endl;
        offset += iter->second + 8 + iter->first.length();
        checkByteNum = 0;
    }
    output << lineBuffer << "0" << std::endl;
    output << "};" << std::endl;
    output.close();
    std::clog << globalCount << " / " << offset << " bytes done." << std::endl;
    return 0;
}